

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O3

Quat<double> * __thiscall
Imath_2_5::Quat<double>::setRotation(Quat<double> *this,Vec3<double> *from,Vec3<double> *to)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Vec3<double> f0;
  Quat<double> q;
  Vec3<double> t0;
  Vec3<double> h0;
  Vec3<double> local_b8;
  Quat<double> local_98;
  Vec3<double> local_78;
  Vec3<double> local_58;
  Vec3<double> local_38;
  
  Vec3<double>::normalized(&local_b8,from);
  Vec3<double>::normalized(&local_58,to);
  if (0.0 <= local_b8.z * local_58.z + local_b8.x * local_58.x + local_b8.y * local_58.y) {
    setRotationInternal(this,&local_b8,&local_58,this);
  }
  else {
    local_98.v.y = local_b8.z + local_58.z;
    local_98.v.x._0_4_ = SUB84(local_b8.y + local_58.y,0);
    local_98.r = local_b8.x + local_58.x;
    local_98.v.x._4_4_ = (int)((ulong)(local_b8.y + local_58.y) >> 0x20);
    Vec3<double>::normalized(&local_38,(Vec3<double> *)&local_98);
    dVar7 = local_38.z * local_38.z + local_38.x * local_38.x + local_38.y * local_38.y;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      setRotationInternal(this,&local_b8,&local_38,this);
      local_98._0_16_ = ZEXT816(0x3ff0000000000000);
      local_98.v.y = 0.0;
      local_98.v.z = 0.0;
      setRotationInternal(this,&local_38,&local_58,&local_98);
      dVar7 = this->r;
      dVar1 = (this->v).z;
      dVar5 = (this->v).x;
      dVar6 = (this->v).y;
      dVar3 = (local_98.v.z * (this->v).y - local_98.v.y * dVar1) +
              local_98.r * dVar5 + dVar7 * local_98.v.x;
      dVar4 = (local_98.v.x * (this->v).z - local_98.v.z * dVar5) +
              local_98.r * dVar6 + dVar7 * local_98.v.y;
      auVar2._8_4_ = SUB84(dVar4,0);
      auVar2._0_8_ = dVar3;
      auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
      (this->v).x = dVar3;
      (this->v).y = (double)auVar2._8_8_;
      (this->v).z = (local_98.v.y * dVar5 - dVar6 * local_98.v.x) +
                    local_98.r * dVar1 + dVar7 * local_98.v.z;
      this->r = dVar7 * local_98.r -
                (dVar1 * local_98.v.z + dVar5 * local_98.v.x + dVar6 * local_98.v.y);
    }
    else {
      this->r = 0.0;
      if ((local_b8.y * local_b8.y < local_b8.x * local_b8.x) ||
         (local_b8.z * local_b8.z < local_b8.x * local_b8.x)) {
        if (local_b8.y * local_b8.y <= local_b8.z * local_b8.z) {
          local_78.z = local_b8.y * -0.0 + local_b8.x;
          local_78.x = local_b8.y * 0.0 + -local_b8.z;
          local_78.y = local_b8.z * 0.0 + local_b8.x * -0.0;
        }
        else {
          local_78.x = local_b8.z * -0.0 + local_b8.y;
          local_78.y = local_b8.z * 0.0 + -local_b8.x;
          local_78.z = local_b8.x * 0.0 + local_b8.y * -0.0;
        }
      }
      else {
        local_78.x = local_b8.y * 0.0 + local_b8.z * -0.0;
        local_78.y = local_b8.z - local_b8.x * 0.0;
        local_78.z = local_b8.x * 0.0 - local_b8.y;
      }
      Vec3<double>::normalized((Vec3<double> *)&local_98,&local_78);
      (this->v).x = local_98.r;
      (this->v).y = local_98.v.x;
      (this->v).z = local_98.v.y;
    }
  }
  return this;
}

Assistant:

Quat<T> &
Quat<T>::setRotation (const Vec3<T> &from, const Vec3<T> &to)
{
    //
    // Create a quaternion that rotates vector from into vector to,
    // such that the rotation is around an axis that is the cross
    // product of from and to.
    //
    // This function calls function setRotationInternal(), which is
    // numerically accurate only for rotation angles that are not much
    // greater than pi/2.  In order to achieve good accuracy for angles
    // greater than pi/2, we split large angles in half, and rotate in
    // two steps.
    //

    //
    // Normalize from and to, yielding f0 and t0.
    //

    Vec3<T> f0 = from.normalized();
    Vec3<T> t0 = to.normalized();

    if ((f0 ^ t0) >= 0)
    {
	//
	// The rotation angle is less than or equal to pi/2.
	//

	setRotationInternal (f0, t0, *this);
    }
    else
    {
	//
	// The angle is greater than pi/2.  After computing h0,
	// which is halfway between f0 and t0, we rotate first
	// from f0 to h0, then from h0 to t0.
	//

	Vec3<T> h0 = (f0 + t0).normalized();

	if ((h0 ^ h0) != 0)
	{
	    setRotationInternal (f0, h0, *this);

	    Quat<T> q;
	    setRotationInternal (h0, t0, q);

	    *this *= q;
	}
	else
	{
	    //
	    // f0 and t0 point in exactly opposite directions.
	    // Pick an arbitrary axis that is orthogonal to f0,
	    // and rotate by pi.
	    //

	    r = T (0);

	    Vec3<T> f02 = f0 * f0;

	    if (f02.x <= f02.y && f02.x <= f02.z)
		v = (f0 % Vec3<T> (1, 0, 0)).normalized();
	    else if (f02.y <= f02.z)
		v = (f0 % Vec3<T> (0, 1, 0)).normalized();
	    else
		v = (f0 % Vec3<T> (0, 0, 1)).normalized();
	}
    }

    return *this;
}